

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void reverse(lua_State *L,StkId from,StkId to)

{
  ushort uVar1;
  GCObject *pGVar2;
  TValue *io2_2;
  TValue *io1_2;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  TValue temp;
  StkId to_local;
  StkId from_local;
  lua_State *L_local;
  
  temp._8_8_ = to;
  to_local = from;
  do {
    if ((ulong)temp._8_8_ <= to_local) {
      return;
    }
    pGVar2 = (to_local->value_).gc;
    uVar1 = to_local->tt_;
    if ((uVar1 & 0x8000) != 0) {
      if ((uVar1 & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xc9,"void reverse(lua_State *, StkId, StkId)");
      }
      if ((uVar1 & 0x7f) != (ushort)pGVar2->tt) {
LAB_0010def6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xc9,"void reverse(lua_State *, StkId, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((uVar1 & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xc9,"void reverse(lua_State *, StkId, StkId)");
        }
        if ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0010def6;
      }
    }
    to_local->value_ = *(Value *)temp._8_8_;
    to_local->tt_ = *(LuaType *)(temp._8_8_ + 8);
    if ((to_local->tt_ & 0x8000) != 0) {
      if ((to_local->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xca,"void reverse(lua_State *, StkId, StkId)");
      }
      if ((to_local->tt_ & 0x7f) != (ushort)((to_local->value_).gc)->tt) {
LAB_0010e009:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xca,"void reverse(lua_State *, StkId, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((to_local->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xca,"void reverse(lua_State *, StkId, StkId)");
        }
        if ((((to_local->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
        goto LAB_0010e009;
      }
    }
    *(GCObject **)temp._8_8_ = pGVar2;
    *(ushort *)(temp._8_8_ + 8) = uVar1;
    if ((*(ushort *)(temp._8_8_ + 8) & 0x8000) != 0) {
      if ((*(ushort *)(temp._8_8_ + 8) & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xcb,"void reverse(lua_State *, StkId, StkId)");
      }
      if ((*(ushort *)(temp._8_8_ + 8) & 0x7f) != (ushort)*(byte *)(*(long *)temp._8_8_ + 8)) {
LAB_0010e11c:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0xcb,"void reverse(lua_State *, StkId, StkId)");
      }
      if (L != (lua_State *)0x0) {
        if ((*(ushort *)(temp._8_8_ + 8) & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0xcb,"void reverse(lua_State *, StkId, StkId)");
        }
        if ((*(byte *)(*(long *)temp._8_8_ + 9) & (L->l_G->currentwhite ^ 0x18)) != 0)
        goto LAB_0010e11c;
      }
    }
    to_local = to_local + 1;
    temp._8_8_ = temp._8_8_ + -0x10;
  } while( true );
}

Assistant:

static void reverse (lua_State *L, StkId from, StkId to) {
  for (; from < to; from++, to--) {
    TValue temp;
    setobj(L, &temp, from);
    setobjs2s(L, from, to);
    setobj2s(L, to, &temp);
  }
}